

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-view.h
# Opt level: O1

Result __thiscall
wabt::anon_unknown_78::BinaryReaderIR::OnLocalName
          (BinaryReaderIR *this,Index func_index,Index param_2,string_view name)

{
  string_view name_00;
  string *orig_name;
  BindingHash *this_00;
  undefined1 local_88 [48];
  char local_58 [8];
  char *in_stack_ffffffffffffffb0;
  size_type in_stack_ffffffffffffffb8;
  
  orig_name = (string *)name.data_;
  if (name.size_ != 0) {
    this_00 = &(this->module_->funcs).
               super__Vector_base<wabt::Func_*,_std::allocator<wabt::Func_*>_>._M_impl.
               super__Vector_impl_data._M_start[func_index]->bindings;
    name_00.size_ = in_stack_ffffffffffffffb8;
    name_00.data_ = in_stack_ffffffffffffffb0;
    (anonymous_namespace)::MakeDollarName_abi_cxx11_(name_00);
    GetUniqueName((string *)(local_88 + 0x20),(BinaryReaderIR *)this_00,(BindingHash *)local_88,
                  orig_name);
    std::
    _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,wabt::Binding>,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,false>>
    ::_M_emplace<std::__cxx11::string,wabt::Binding>
              ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,wabt::Binding>,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,false>>
                *)this_00,0,(string *)(local_88 + 0x20));
    if ((char *)local_88._32_8_ != local_58) {
      operator_delete((void *)local_88._32_8_);
    }
    if ((undefined1 *)local_88._0_8_ != local_88 + 0x10) {
      operator_delete((void *)local_88._0_8_);
    }
  }
  return (Result)Ok;
}

Assistant:

constexpr inline bool string_view::empty() const noexcept {
  return size_ == 0;
}